

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilksort-seq.c
# Opt level: O0

void scramble_array(ELM *arr,unsigned_long size)

{
  ELM EVar1;
  unsigned_long uVar2;
  ELM tmp;
  unsigned_long j;
  unsigned_long i;
  unsigned_long size_local;
  ELM *arr_local;
  
  for (j = 0; j < size; j = j + 1) {
    uVar2 = my_rand();
    EVar1 = arr[j];
    arr[j] = arr[uVar2 % size];
    arr[uVar2 % size] = EVar1;
  }
  return;
}

Assistant:

void scramble_array(ELM *arr, unsigned long size)
{
    unsigned long i;
    unsigned long j;

    for (i = 0; i < size; ++i) {
        j = my_rand();
        j = j % size;
        swap(arr[i], arr[j]);
    }
}